

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

int fits_hcompress64(LONGLONG *a,int ny,int nx,int scale,char *output,long *nbytes,int *status)

{
  long lVar1;
  long lVar2;
  sbyte sVar3;
  void *__src;
  ulong uVar4;
  long lVar5;
  sbyte sVar6;
  undefined4 in_register_0000000c;
  long lVar7;
  char cVar8;
  int iVar9;
  undefined4 in_register_00000014;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  LONGLONG *pLVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  LONGLONG *pLVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  undefined2 local_f3;
  byte local_f1;
  uint local_f0;
  uint local_ec;
  ulong local_e8;
  long local_e0;
  char *local_d8;
  double local_d0;
  long *local_c8;
  long local_c0;
  int local_b4;
  ulong local_b0;
  LONGLONG *local_a8;
  ulong local_a0;
  ulong local_98;
  LONGLONG *local_90;
  int local_88;
  uint local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  ulong local_60;
  long local_58;
  LONGLONG *local_50;
  LONGLONG vmax [3];
  
  local_68 = CONCAT44(in_register_0000000c,scale);
  if (0 < *status) {
    return *status;
  }
  uVar24 = (ulong)(uint)ny;
  iVar15 = ny;
  if (ny < nx) {
    iVar15 = nx;
  }
  local_d8 = output;
  local_c8 = nbytes;
  local_a8 = a;
  local_d0 = log((double)iVar15);
  local_90 = (LONGLONG *)malloc((long)((iVar15 + 1) / 2) << 3);
  if (local_90 == (LONGLONG *)0x0) {
    ffpmsg("htrans64: insufficient memory");
    iVar15 = 0x19d;
    goto LAB_0016fca7;
  }
  local_88 = (int)(local_d0 / 0.6931471805599453 + 0.5);
  local_88 = (uint)(1 << ((byte)local_88 & 0x1f) < iVar15) + local_88;
  local_78 = ny * 2;
  if (local_88 < 1) {
    local_88 = 0;
  }
  local_50 = local_a8 + 1;
  local_58 = (long)ny << 3;
  local_e8 = 0xfffffffffffffffc;
  local_a0 = 0xfffffffffffffffe;
  local_e0 = 2;
  uVar29 = 0;
  local_c0 = 1;
  iVar15 = 0;
  lVar5 = 1;
  pLVar27 = local_a8;
  local_f0 = nx;
  local_ec = ny;
  local_b0 = CONCAT44(in_register_00000014,nx);
  local_98 = uVar24;
  while (iVar23 = (int)uVar24, iVar15 != local_88) {
    local_80 = (int)local_f0 % 2;
    local_b4 = (int)local_ec % 2;
    local_74 = local_f0 - local_80;
    iVar14 = local_ec - local_b4;
    local_d0 = (double)CONCAT44(local_d0._4_4_,iVar14);
    sVar3 = (sbyte)uVar29;
    local_60 = (ulong)(uVar29 ^ 1);
    uVar12 = uVar24 & 0xffffffff;
    iVar19 = 0;
    iVar23 = 0;
    while( true ) {
      iVar16 = iVar23;
      lVar21 = (long)iVar16;
      sVar6 = (sbyte)(uVar29 ^ 1);
      if (local_74 <= iVar19) break;
      lVar22 = lVar21 << 0x20;
      local_70 = (int)uVar12;
      lVar25 = (long)local_70;
      lVar26 = lVar25 << 0x20;
      for (lVar10 = 0; (int)lVar10 < iVar14; lVar10 = lVar10 + 2) {
        lVar7 = local_50[lVar25 + lVar10 + -1] + local_50[lVar25 + lVar10];
        lVar1 = local_50[lVar21 + lVar10 + -1];
        lVar2 = local_50[lVar21 + lVar10];
        lVar11 = local_50[lVar25 + lVar10] - local_50[lVar25 + lVar10 + -1];
        lVar28 = lVar1 + lVar2 + lVar7 >> sVar3;
        lVar13 = lVar7 - (lVar1 + lVar2) >> sVar3;
        lVar30 = (lVar11 + lVar2) - lVar1 >> sVar3;
        local_50[lVar25 + lVar10] = (lVar11 - lVar2) + lVar1 >> sVar3;
        lVar7 = lVar5;
        if (lVar13 < 0) {
          lVar7 = 0;
        }
        local_50[lVar25 + lVar10 + -1] = lVar7 + lVar13 & local_a0;
        lVar7 = lVar5;
        if (lVar30 < 0) {
          lVar7 = 0;
        }
        local_50[lVar21 + lVar10] = lVar7 + lVar30 & local_a0;
        lVar7 = local_e0;
        if (lVar28 < 0) {
          lVar7 = local_c0;
        }
        local_50[lVar21 + lVar10 + -1] = lVar7 + lVar28 & local_e8;
        lVar22 = lVar22 + 0x200000000;
        lVar26 = lVar26 + 0x200000000;
      }
      if (local_b4 != 0) {
        lVar21 = *(long *)((long)local_a8 + (lVar26 >> 0x1d));
        lVar10 = *(long *)((long)local_a8 + (lVar22 >> 0x1d));
        lVar25 = lVar10 + lVar21 << sVar6;
        lVar10 = lVar21 - lVar10 << sVar6;
        lVar21 = lVar5;
        if (lVar10 < 0) {
          lVar21 = 0;
        }
        lVar7 = local_e0;
        if (lVar25 < 0) {
          lVar7 = local_c0;
        }
        *(ulong *)((long)local_a8 + (lVar26 >> 0x1d)) = lVar21 + lVar10 & local_a0;
        *(ulong *)((long)local_a8 + (lVar22 >> 0x1d)) = lVar7 + lVar25 & local_e8;
      }
      iVar19 = iVar19 + 2;
      uVar12 = (ulong)(uint)(local_70 + local_78);
      uVar24 = local_98;
      pLVar27 = local_a8;
      iVar23 = iVar16 + local_78;
      local_6c = iVar16;
    }
    if (local_80 != 0) {
      lVar22 = lVar21 << 0x20;
      for (lVar10 = 0; (int)lVar10 < iVar14; lVar10 = lVar10 + 2) {
        lVar7 = local_50[lVar21 + lVar10 + -1] + local_50[lVar21 + lVar10] << sVar6;
        lVar26 = local_50[lVar21 + lVar10] - local_50[lVar21 + lVar10 + -1] << sVar6;
        lVar25 = lVar5;
        if (lVar26 < 0) {
          lVar25 = 0;
        }
        local_50[lVar21 + lVar10] = lVar25 + lVar26 & local_a0;
        lVar25 = local_e0;
        if (lVar7 < 0) {
          lVar25 = local_c0;
        }
        local_50[lVar21 + lVar10 + -1] = lVar25 + lVar7 & local_e8;
        lVar22 = lVar22 + 0x200000000;
      }
      if (local_b4 != 0) {
        lVar21 = *(long *)((long)pLVar27 + (lVar22 >> 0x1d)) << (2U - sVar3 & 0x3f);
        lVar5 = local_c0;
        if (-1 < lVar21) {
          lVar5 = local_e0;
        }
        *(ulong *)((long)pLVar27 + (lVar22 >> 0x1d)) = lVar5 + lVar21 & local_e8;
      }
    }
    uVar12 = 0;
    pLVar20 = pLVar27;
    local_84 = uVar29;
    local_7c = iVar15;
    if (0 < (int)local_f0) {
      uVar12 = (ulong)local_f0;
    }
    while (bVar32 = uVar12 != 0, uVar12 = uVar12 - 1, bVar32) {
      shuffle64(pLVar20,local_ec,1,local_90);
      pLVar20 = (LONGLONG *)((long)pLVar20 + local_58);
    }
    uVar12 = 0;
    pLVar20 = pLVar27;
    if (0 < (int)local_ec) {
      uVar12 = (ulong)local_ec;
    }
    while (bVar32 = uVar12 != 0, uVar12 = uVar12 - 1, bVar32) {
      shuffle64(pLVar20,local_f0,(int)uVar24,local_90);
      pLVar20 = pLVar20 + 1;
    }
    local_f0 = (int)(local_f0 + 1) >> 1;
    local_ec = (int)(local_ec + 1) >> 1;
    local_a0 = local_e8;
    local_e8 = local_e8 * 2;
    local_c0 = local_e0 * 2 + -1;
    uVar29 = 1;
    lVar5 = local_e0;
    local_e0 = local_e0 * 2;
    iVar15 = local_7c + 1;
  }
  free(local_90);
  pcVar17 = local_d8;
  iVar15 = (int)local_b0;
  if (1 < (int)local_68) {
    uVar12 = (ulong)(((int)local_68 + 1U >> 1) - 1);
    for (pLVar20 = pLVar27; pLVar20 <= pLVar27 + (long)(iVar15 * iVar23) + -1; pLVar20 = pLVar20 + 1
        ) {
      uVar4 = -uVar12;
      if (0 < *pLVar20) {
        uVar4 = uVar12;
      }
      *pLVar20 = (long)(uVar4 + *pLVar20) / (long)(local_68 & 0xffffffff);
    }
  }
  uVar29 = iVar15 * iVar23;
  lVar5 = *local_c8;
  noutmax = lVar5;
  *local_c8 = 0;
  noutchar = 0;
  if (1 < lVar5) {
    local_d8[0] = -0x23;
    local_d8[1] = -0x67;
    noutchar = 2;
  }
  writeint(local_d8,iVar15);
  writeint(pcVar17,iVar23);
  writeint(pcVar17,(int)local_68);
  writelonglong(pcVar17,*pLVar27);
  *pLVar27 = 0;
  __src = calloc(1,(long)((int)(uVar29 + 7) / 8));
  pLVar20 = local_a8;
  if (__src == (void *)0x0) {
    pcVar17 = "encode64: insufficient memory";
  }
  else {
    uVar4 = 0;
    uVar12 = (ulong)uVar29;
    if ((int)uVar29 < 1) {
      uVar12 = uVar4;
    }
    uVar31 = 0;
    iVar15 = 8;
    for (; uVar29 = (uint)uVar31, uVar12 != uVar4; uVar4 = uVar4 + 1) {
      lVar5 = pLVar27[uVar4];
      if (lVar5 < 1) {
        if (lVar5 < 0) {
          *(char *)((long)__src + uVar31) = *(char *)((long)__src + uVar31) * '\x02' + '\x01';
          iVar15 = iVar15 + -1;
          pLVar27[uVar4] = -lVar5;
        }
      }
      else {
        *(char *)((long)__src + uVar31) = *(char *)((long)__src + uVar31) << 1;
        iVar15 = iVar15 + -1;
      }
      bVar32 = iVar15 == 0;
      if (bVar32) {
        iVar15 = 8;
      }
      uVar31 = (ulong)(uVar29 + bVar32);
    }
    if (iVar15 != 8) {
      *(char *)((long)__src + uVar31) = *(char *)((long)__src + uVar31) << ((byte)iVar15 & 0x1f);
      uVar29 = uVar29 + 1;
    }
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      vmax[lVar5] = 0;
    }
    iVar19 = ((int)local_b0 + 1) / 2;
    iVar14 = (iVar23 + 1) / 2;
    iVar15 = 0;
    iVar16 = 0;
    for (uVar4 = 0; uVar12 != uVar4; uVar4 = uVar4 + 1) {
      uVar18 = (uint)(iVar19 <= iVar16) + (uint)(iVar14 <= iVar15);
      lVar5 = local_a8[uVar4];
      if (local_a8[uVar4] < vmax[uVar18]) {
        lVar5 = vmax[uVar18];
      }
      vmax[uVar18] = lVar5;
      iVar9 = iVar15 + 1;
      iVar15 = iVar9;
      if (iVar23 <= iVar9) {
        iVar15 = 0;
      }
      iVar16 = iVar16 + (uint)(iVar23 <= iVar9);
    }
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      cVar8 = '\0';
      for (uVar12 = vmax[lVar5]; 0 < (long)uVar12; uVar12 = uVar12 >> 1) {
        cVar8 = cVar8 + '\x01';
      }
      *(char *)((long)&local_f3 + lVar5) = cVar8;
      vmax[lVar5] = uVar12;
    }
    lVar5 = noutchar;
    if (noutmax < noutchar + 3) {
LAB_0016fc0f:
      *local_c8 = lVar5;
      pcVar17 = "encode: output buffer too small";
    }
    else {
      local_d8[noutchar + 2] = local_f1;
      *(undefined2 *)(local_d8 + noutchar) = local_f3;
      buffer2 = 0;
      bits_to_go2 = 8;
      bitcount = 0;
      noutchar = noutchar + 3;
      iVar15 = qtree_encode64(local_d8,local_a8,iVar23,iVar19,iVar14,(uint)(byte)local_f3);
      if (iVar15 == 0) {
        iVar15 = (int)((long)((ulong)(uint)(iVar23 >> 0x1f) << 0x20 | uVar24 & 0xffffffff) / 2);
        local_e0 = CONCAT44(local_e0._4_4_,iVar15);
        local_d0 = (double)CONCAT44(local_d0._4_4_,(uint)local_f3._1_1_);
        iVar15 = qtree_encode64(local_d8,pLVar20 + iVar14,iVar23,iVar19,iVar15,(uint)local_f3._1_1_)
        ;
        if (iVar15 == 0) {
          iVar19 = iVar19 * (int)local_98;
          iVar15 = (int)((long)((ulong)(uint)((int)local_b0 >> 0x1f) << 0x20 | local_b0 & 0xffffffff
                               ) / 2);
          local_e8 = CONCAT44(local_e8._4_4_,iVar15);
          iVar15 = qtree_encode64(local_d8,pLVar20 + iVar19,(int)local_98,iVar15,iVar14,
                                  local_d0._0_4_);
          if (iVar15 == 0) {
            iVar15 = qtree_encode64(local_d8,pLVar20 + (iVar19 + iVar14),(int)local_98,(int)local_e8
                                    ,(int)local_e0,(uint)local_f1);
          }
        }
      }
      pcVar17 = local_d8;
      output_nybble(local_d8,0);
      done_outputing_bits(pcVar17);
      lVar5 = noutchar;
      lVar21 = noutmax;
      if (0 < (int)uVar29) {
        lVar10 = noutchar + (ulong)uVar29;
        if (noutmax < lVar10) {
          free(__src);
          goto LAB_0016fc0f;
        }
        memcpy(local_d8 + noutchar,__src,(ulong)uVar29);
        noutchar = lVar10;
      }
      lVar5 = noutchar;
      free(__src);
      *local_c8 = lVar5;
      if (lVar5 < lVar21) goto LAB_0016fca7;
      pcVar17 = "encode64: output buffer too small";
    }
  }
  ffpmsg(pcVar17);
  iVar15 = 0x19d;
LAB_0016fca7:
  *status = iVar15;
  return iVar15;
}

Assistant:

int fits_hcompress64(LONGLONG *a, int ny, int nx, int scale, char *output, 
                  long *nbytes, int *status)
{
  /* 
     compress the input image using the H-compress algorithm
  
   a  - input image array
   nx - size of X axis of image
   ny - size of Y axis of image
   scale - quantization scale factor. Larger values results in more (lossy) compression
           scale = 0 does lossless compression
   output - pre-allocated array to hold the output compressed stream of bytes
   nbyts  - size of the compressed byte stream, in bytes

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */

  int stat;
  
  if (*status > 0) return(*status);

  /* H-transform */
  stat = htrans64(a, nx, ny);
  if (stat) {
     *status = stat;
     return(*status);
  }

  /* digitize */
  digitize64(a, nx, ny, scale);

  /* encode and write to output array */

  FFLOCK;
  noutmax = *nbytes;  /* input value is the allocated size of the array */
  *nbytes = 0;  /* reset */

  stat = encode64(output, nbytes, a, nx, ny, scale);
  FFUNLOCK;

  *status = stat;
  return(*status);
}